

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadeVertices
          (VertexVaryingShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int iVar1;
  VertexPacket *pVVar2;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [8];
  Vec4 color;
  int ndx;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  VertexVaryingShader *this_local;
  
  if (*(int *)&(this->super_ShaderProgram).field_0x154 != -1) {
    color.m_data[3] = (float)numPackets;
    for (color.m_data[2] = 0.0; (int)color.m_data[2] < (int)color.m_data[3];
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      rr::readVertexAttribFloat
                ((rr *)local_38,inputs + 1,packets[(int)color.m_data[2]]->instanceNdx,
                 packets[(int)color.m_data[2]]->vertexNdx);
      rr::readVertexAttribFloat
                ((rr *)&local_48,inputs,packets[(int)color.m_data[2]]->instanceNdx,
                 packets[(int)color.m_data[2]]->vertexNdx);
      pVVar2 = packets[(int)color.m_data[2]];
      *(undefined8 *)(pVVar2->position).m_data = local_48;
      *(undefined8 *)((pVVar2->position).m_data + 2) = uStack_40;
      packets[(int)color.m_data[2]]->pointSize = 1.0;
      iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
      if (iVar1 != 0) {
        if (iVar1 == 1) {
          rr::GenericVec4::operator=
                    (packets[(int)color.m_data[2]]->outputs,(Vector<float,_4> *)local_38);
        }
        else if (iVar1 == 2) {
          tcu::operator*((tcu *)&local_58,(Vector<float,_4> *)local_38,0.5);
          rr::GenericVec4::operator=(packets[(int)color.m_data[2]]->outputs,&local_58);
          tcu::Vector<float,_4>::swizzle(&local_78,(int)local_38,2,1,0);
          tcu::operator*((tcu *)&local_68,&local_78,0.5);
          rr::GenericVec4::operator=((GenericVec4 *)(packets[(int)color.m_data[2]] + 1),&local_68);
        }
      }
    }
  }
  return;
}

Assistant:

void VertexVaryingShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	// vertex shader is no-op
	if (m_vertexOut == -1)
		return;

	for (int ndx = 0; ndx < numPackets; ++ndx)
	{
		const tcu::Vec4 color = rr::readVertexAttribFloat(inputs[1], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);

		packets[ndx]->position = rr::readVertexAttribFloat(inputs[0], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
		packets[ndx]->pointSize = 1.0f;

		switch (m_vertexOut)
		{
			case 0:
				break;

			case 1:
				packets[ndx]->outputs[0] = color;
				break;

			case 2:
				packets[ndx]->outputs[0] = color * 0.5f;
				packets[ndx]->outputs[1] = color.swizzle(2,1,0,3) * 0.5f;
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}